

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSpinBarrier.cpp
# Opt level: O0

void de::anon_unknown_0::multiThreadRemoveTest(int numThreads,WaitMode waitMode)

{
  deBool dVar1;
  TestExitThread *this;
  reference ppTVar2;
  bool bVar3;
  int local_64;
  int local_60;
  int ndx_1;
  int ndx;
  allocator<de::(anonymous_namespace)::TestExitThread_*> local_49;
  value_type local_48;
  undefined1 local_40 [8];
  vector<de::(anonymous_namespace)::TestExitThread_*,_std::allocator<de::(anonymous_namespace)::TestExitThread_*>_>
  threads;
  SpinBarrier barrier;
  WaitMode waitMode_local;
  int numThreads_local;
  
  SpinBarrier::SpinBarrier
            ((SpinBarrier *)
             ((long)&threads.
                     super__Vector_base<de::(anonymous_namespace)::TestExitThread_*,_std::allocator<de::(anonymous_namespace)::TestExitThread_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),numThreads);
  local_48 = (value_type)0x0;
  std::allocator<de::(anonymous_namespace)::TestExitThread_*>::allocator(&local_49);
  std::
  vector<de::(anonymous_namespace)::TestExitThread_*,_std::allocator<de::(anonymous_namespace)::TestExitThread_*>_>
  ::vector((vector<de::(anonymous_namespace)::TestExitThread_*,_std::allocator<de::(anonymous_namespace)::TestExitThread_*>_>
            *)local_40,(long)numThreads,&local_48,&local_49);
  std::allocator<de::(anonymous_namespace)::TestExitThread_*>::~allocator(&local_49);
  for (local_60 = 0; local_60 < numThreads; local_60 = local_60 + 1) {
    this = (TestExitThread *)operator_new(0x30);
    TestExitThread::TestExitThread
              (this,(SpinBarrier *)
                    ((long)&threads.
                            super__Vector_base<de::(anonymous_namespace)::TestExitThread_*,_std::allocator<de::(anonymous_namespace)::TestExitThread_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),numThreads,
               local_60,waitMode);
    ppTVar2 = std::
              vector<de::(anonymous_namespace)::TestExitThread_*,_std::allocator<de::(anonymous_namespace)::TestExitThread_*>_>
              ::operator[]((vector<de::(anonymous_namespace)::TestExitThread_*,_std::allocator<de::(anonymous_namespace)::TestExitThread_*>_>
                            *)local_40,(long)local_60);
    *ppTVar2 = this;
    do {
      dVar1 = ::deGetFalse();
      bVar3 = false;
      if (dVar1 == 0) {
        ppTVar2 = std::
                  vector<de::(anonymous_namespace)::TestExitThread_*,_std::allocator<de::(anonymous_namespace)::TestExitThread_*>_>
                  ::operator[]((vector<de::(anonymous_namespace)::TestExitThread_*,_std::allocator<de::(anonymous_namespace)::TestExitThread_*>_>
                                *)local_40,(long)local_60);
        bVar3 = *ppTVar2 != (value_type)0x0;
      }
      if (!bVar3) {
        deAssertFail("threads[ndx]",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deSpinBarrier.cpp"
                     ,0x13d);
      }
      dVar1 = ::deGetFalse();
    } while (dVar1 != 0);
    ppTVar2 = std::
              vector<de::(anonymous_namespace)::TestExitThread_*,_std::allocator<de::(anonymous_namespace)::TestExitThread_*>_>
              ::operator[]((vector<de::(anonymous_namespace)::TestExitThread_*,_std::allocator<de::(anonymous_namespace)::TestExitThread_*>_>
                            *)local_40,(long)local_60);
    Thread::start(&(*ppTVar2)->super_Thread);
  }
  for (local_64 = 0; local_64 < numThreads; local_64 = local_64 + 1) {
    ppTVar2 = std::
              vector<de::(anonymous_namespace)::TestExitThread_*,_std::allocator<de::(anonymous_namespace)::TestExitThread_*>_>
              ::operator[]((vector<de::(anonymous_namespace)::TestExitThread_*,_std::allocator<de::(anonymous_namespace)::TestExitThread_*>_>
                            *)local_40,(long)local_64);
    Thread::join(&(*ppTVar2)->super_Thread);
    ppTVar2 = std::
              vector<de::(anonymous_namespace)::TestExitThread_*,_std::allocator<de::(anonymous_namespace)::TestExitThread_*>_>
              ::operator[]((vector<de::(anonymous_namespace)::TestExitThread_*,_std::allocator<de::(anonymous_namespace)::TestExitThread_*>_>
                            *)local_40,(long)local_64);
    if (*ppTVar2 != (value_type)0x0) {
      (*((*ppTVar2)->super_Thread)._vptr_Thread[1])();
    }
  }
  std::
  vector<de::(anonymous_namespace)::TestExitThread_*,_std::allocator<de::(anonymous_namespace)::TestExitThread_*>_>
  ::~vector((vector<de::(anonymous_namespace)::TestExitThread_*,_std::allocator<de::(anonymous_namespace)::TestExitThread_*>_>
             *)local_40);
  SpinBarrier::~SpinBarrier
            ((SpinBarrier *)
             ((long)&threads.
                     super__Vector_base<de::(anonymous_namespace)::TestExitThread_*,_std::allocator<de::(anonymous_namespace)::TestExitThread_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  return;
}

Assistant:

void multiThreadRemoveTest (int numThreads, SpinBarrier::WaitMode waitMode)
{
	SpinBarrier						barrier		(numThreads);
	std::vector<TestExitThread*>	threads		(numThreads, static_cast<TestExitThread*>(DE_NULL));

	for (int ndx = 0; ndx < numThreads; ndx++)
	{
		threads[ndx] = new TestExitThread(barrier, numThreads, ndx, waitMode);
		DE_TEST_ASSERT(threads[ndx]);
		threads[ndx]->start();
	}

	for (int ndx = 0; ndx < numThreads; ndx++)
	{
		threads[ndx]->join();
		delete threads[ndx];
	}
}